

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O2

ssize_t __thiscall Sound_Queue::write(Sound_Queue *this,int __fd,void *__buf,size_t __n)

{
  void *in_RAX;
  sample_t *psVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  void *__src;
  int iVar4;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  uVar3 = (ulong)__buf & 0xffffffff;
  while (iVar2 = (int)uVar3, iVar2 != 0) {
    iVar4 = 0x800 - this->write_pos;
    if (iVar2 <= iVar4) {
      iVar4 = iVar2;
    }
    psVar1 = buf(this,this->write_buf);
    in_RAX = memcpy(psVar1 + this->write_pos,__src,(long)iVar4 * 2);
    __src = (void *)((long)__src + (long)iVar4 * 2);
    uVar3 = (ulong)(uint)(iVar2 - iVar4);
    iVar4 = iVar4 + this->write_pos;
    this->write_pos = iVar4;
    if (0x7ff < iVar4) {
      this->write_pos = 0;
      this->write_buf = (this->write_buf + 1) % 3;
      in_RAX = (void *)SDL_SemWait(this->free_sem);
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void Sound_Queue::write( const sample_t* in, int count )
{
	while ( count )
	{
		int n = buf_size - write_pos;
		if ( n > count )
			n = count;
		
		memcpy( buf( write_buf ) + write_pos, in, n * sizeof (sample_t) );
		in += n;
		write_pos += n;
		count -= n;
		
		if ( write_pos >= buf_size )
		{
			write_pos = 0;
			write_buf = (write_buf + 1) % buf_count;
			SDL_SemWait( free_sem );
		}
	}
}